

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O2

int __thiscall Cleaner::CleanDead(Cleaner *this,Entries *entries)

{
  Node *pNVar1;
  __node_base *p_Var2;
  string sStack_38;
  
  Reset(this);
  PrintHeader(this);
  p_Var2 = &(entries->_M_h)._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    pNVar1 = State::LookupNode(this->state_,*(StringPiece *)(p_Var2 + 1));
    if ((pNVar1 == (Node *)0x0) ||
       ((pNVar1->in_edge_ == (Edge *)0x0 &&
        ((pNVar1->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
         super__Vector_impl_data._M_start ==
         (pNVar1->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
         super__Vector_impl_data._M_finish)))) {
      StringPiece::AsString_abi_cxx11_(&sStack_38,(StringPiece *)(p_Var2 + 1));
      Remove(this,&sStack_38);
      std::__cxx11::string::~string((string *)&sStack_38);
    }
  }
  PrintFooter(this);
  return this->status_;
}

Assistant:

int Cleaner::CleanDead(const BuildLog::Entries& entries) {
  Reset();
  PrintHeader();
  for (BuildLog::Entries::const_iterator i = entries.begin(); i != entries.end(); ++i) {
    Node* n = state_->LookupNode(i->first);
    // Detecting stale outputs works as follows:
    //
    // - If it has no Node, it is not in the build graph, or the deps log
    //   anymore, hence is stale.
    //
    // - If it isn't an output or input for any edge, it comes from a stale
    //   entry in the deps log, but no longer referenced from the build
    //   graph.
    //
    if (!n || (!n->in_edge() && n->out_edges().empty())) {
      Remove(i->first.AsString());
    }
  }
  PrintFooter();
  return status_;
}